

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

inner_node * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::allocate_inner(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                 *this,unsigned_short level)

{
  size_type *psVar1;
  inner_node *__s;
  
  __s = (inner_node *)operator_new(0x110);
  memset(__s,0,0x110);
  (__s->super_node).level = level;
  psVar1 = &(this->m_stats).innernodes;
  *psVar1 = *psVar1 + 1;
  return __s;
}

Assistant:

inline inner_node* allocate_inner(unsigned short level)
        {
            inner_node *n = new (inner_node_allocator().allocate(1)) inner_node();
            n->initialize(level);
            m_stats.innernodes++;
            return n;
        }